

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb_main.c
# Opt level: O2

int main(int argc,char **argv)

{
  libdir *plVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  boolean bVar6;
  int iVar7;
  int iVar8;
  int __fd;
  int iVar9;
  long lVar10;
  size_t sVar11;
  FILE *pFVar12;
  FILE *__stream;
  __off_t _Var13;
  ssize_t sVar14;
  char **unaff_RBX;
  char **str;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  uint unaff_R12D;
  long lVar18;
  FILE **ppFVar19;
  libdir *plVar20;
  uint uVar21;
  library *plVar22;
  char cVar23;
  size_t sVar24;
  ulong uVar25;
  bool bVar26;
  long local_3fb0;
  long local_3fa8;
  library lib;
  char buf [8192];
  
  if (0 < argc) {
    pcVar17 = *argv;
    if ((pcVar17 != (char *)0x0) && (*pcVar17 != '\0')) {
      progname = pcVar17;
    }
    unaff_RBX = argv;
    unaff_R12D = argc;
    if (argc != 1) goto LAB_001022fc;
  }
LAB_001022f7:
  usage();
LAB_001022fc:
  uVar21 = 2;
  cVar23 = ' ';
  lVar16 = 0;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  do {
    cVar2 = unaff_RBX[1][lVar16];
    if (cVar2 != '-') {
      if (cVar2 == 'C') {
        if (uVar21 == unaff_R12D) goto LAB_001022f7;
        iVar7 = chdir(unaff_RBX[(int)uVar21]);
        if (iVar7 != 0) {
          pFVar12 = (FILE *)unaff_RBX[(int)uVar21];
          pcVar17 = "Can\'t chdir to %s\n";
          goto LAB_00102470;
        }
        uVar21 = uVar21 + 1;
      }
      else if (cVar2 == 'I') {
        if (uVar21 == unaff_R12D) goto LAB_001022f7;
        lVar10 = (long)(int)uVar21;
        uVar21 = uVar21 + 1;
        list_file = unaff_RBX[lVar10];
        if (bVar5) {
          puts("Warning: multiple I options.  Previous ignored.");
        }
        bVar5 = true;
      }
      else {
        if (cVar2 != 'c') {
          if (cVar2 == 'f') {
            if (uVar21 != unaff_R12D) {
              lVar10 = (long)(int)uVar21;
              uVar21 = uVar21 + 1;
              library_file = unaff_RBX[lVar10];
              if (bVar3) {
                puts("Warning: multiple f options.  Previous ignored.");
              }
              bVar3 = true;
              goto LAB_001023f4;
            }
            goto LAB_001022f7;
          }
          if (cVar2 != 't') {
            if (cVar2 == 'v') {
              bVar4 = true;
              goto LAB_001023f4;
            }
            if (cVar2 != 'x') break;
          }
        }
        bVar26 = cVar23 != ' ';
        cVar23 = cVar2;
        if (bVar26) {
          puts("Only one of t,x,c may be specified.");
          usage();
          goto LAB_0010243d;
        }
      }
    }
LAB_001023f4:
    lVar16 = lVar16 + 1;
  } while( true );
  if (cVar2 == '\0') goto LAB_0010243d;
  if ((cVar2 == 'h') || (cVar2 == '?')) {
    for (unaff_RBX = (char **)&verbose_help_long_help; *unaff_RBX != (char *)0x0;
        unaff_RBX = unaff_RBX + 1) {
      puts(*unaff_RBX);
    }
  }
  goto LAB_001022f7;
LAB_00102819:
  printf("Too many dlb files!  Stopping at %d.\n",0xfa);
  goto LAB_001026b9;
LAB_0010243d:
  uVar15 = (ulong)(int)uVar21;
  if (bVar5 && unaff_RBX[uVar15] != (char *)0x0) {
    pcVar17 = "Too many arguments.";
    goto LAB_001026b4;
  }
  if (cVar23 == 'c') {
    uVar25 = 0;
    if (unaff_RBX[uVar15] != (char *)0x0) {
      plVar22 = &lib;
      for (uVar25 = 0; (long)(uVar25 + uVar15) < (long)(ulong)unaff_R12D; uVar25 = uVar25 + 1) {
        if (uVar25 == 0xfa) goto LAB_00102819;
        pcVar17 = unaff_RBX[uVar15 + uVar25];
        sVar11 = strlen(pcVar17);
        pFVar12 = (FILE *)malloc(sVar11 + 1);
        plVar22->fdata = pFVar12;
        strcpy((char *)pFVar12,pcVar17);
        plVar22 = (library *)&plVar22->nentries;
      }
    }
    if (bVar5) {
      __stream = fopen(list_file,"r");
      if (__stream != (FILE *)0x0) {
        uVar25 = uVar25 & 0xffffffff;
        ppFVar19 = &lib.fdata + uVar25 * 4;
        while (pcVar17 = fgets(buf,0x2000,__stream), pcVar17 != (char *)0x0) {
          if (uVar25 == 0xfa) goto LAB_00102819;
          pcVar17 = eos(buf);
          pcVar17[-1] = '\0';
          sVar11 = strlen(buf);
          pFVar12 = (FILE *)malloc(sVar11 + 1);
          *ppFVar19 = pFVar12;
          strcpy((char *)pFVar12,buf);
          uVar25 = uVar25 + 1;
          ppFVar19 = ppFVar19 + 4;
        }
        fclose(__stream);
        goto LAB_00102839;
      }
      pcVar17 = "Can\'t open %s\n";
      pFVar12 = (FILE *)list_file;
    }
    else {
LAB_00102839:
      iVar7 = (int)uVar25;
      if (iVar7 == 0) {
        pcVar17 = "No files to archive";
        goto LAB_001026b4;
      }
      lVar16 = (uVar25 & 0xffffffff) << 5;
      local_3fb0 = 0;
      lVar10 = 0;
      for (lVar18 = 0; lVar16 != lVar18; lVar18 = lVar18 + 0x20) {
        pFVar12 = *(FILE **)((long)&lib.fdata + lVar18);
        iVar8 = open((char *)pFVar12,0,0);
        if (iVar8 < 0) {
          pcVar17 = "Can\'t open %s\n";
          goto LAB_00102470;
        }
        _Var13 = lseek(iVar8,0,2);
        *(__off_t *)((long)&lib.dir + lVar18) = _Var13;
        *(long *)((long)&lib.fmark + lVar18) = lVar10;
        sVar11 = strlen((char *)pFVar12);
        local_3fb0 = local_3fb0 + sVar11;
        lVar10 = lVar10 + _Var13;
        close(iVar8);
      }
      iVar8 = open(library_file,0x242,0x1b0);
      if (-1 < iVar8) {
        lVar18 = (iVar7 * 0xb + 0x33) + local_3fb0 + 9;
        write_dlb_directory(iVar8,iVar7,(libdir *)&lib,local_3fb0,lVar18,lVar10);
        bVar3 = false;
        local_3fa8 = 0;
        for (uVar15 = 0; uVar15 != (uVar25 & 0xffffffff); uVar15 = uVar15 + 1) {
          pFVar12 = (&lib.fdata)[uVar15 * 4];
          __fd = open((char *)pFVar12,0,0);
          if (__fd < 0) {
            pcVar17 = "Can\'t open input file \'%s\'\n";
            goto LAB_00102470;
          }
          if (bVar4) {
            puts((char *)pFVar12);
          }
          plVar20 = (libdir *)0x0;
          while( true ) {
            sVar14 = read(__fd,buf,0x2000);
            iVar9 = (int)sVar14;
            if (iVar9 == 0) break;
            if (iVar9 == -1) {
              pcVar17 = "Read Error in \'%s\'\n";
              goto LAB_00102470;
            }
            sVar24 = (size_t)iVar9;
            sVar11 = write(iVar8,buf,sVar24);
            plVar20 = (libdir *)((long)&plVar20->fname + sVar24);
            if (sVar11 != sVar24) {
              pcVar17 = "Write Error in \'%s\'\n";
              goto LAB_00102470;
            }
          }
          close(__fd);
          if (plVar20 != (&lib.dir)[uVar15 * 4]) {
            bVar3 = true;
          }
          (&lib.dir)[uVar15 * 4] = plVar20;
          (&lib.fmark)[uVar15 * 4] = local_3fa8;
          local_3fa8 = (long)&plVar20->fname + local_3fa8;
        }
        if (bVar3) {
          if (bVar4) {
            puts("(rewriting dlb directory info)");
          }
          lseek(iVar8,0,0);
          write_dlb_directory(iVar8,iVar7,(libdir *)&lib,local_3fb0,lVar18,local_3fa8);
        }
        for (lVar10 = 0; lVar16 != lVar10; lVar10 = lVar10 + 0x20) {
          free(*(void **)((long)&lib.fdata + lVar10));
          *(undefined8 *)((long)&lib.fdata + lVar10) = 0;
        }
        close(iVar8);
LAB_0010273a:
        exit(0);
      }
      pcVar17 = "Can\'t open %s for output\n";
      pFVar12 = (FILE *)library_file;
    }
LAB_00102470:
    printf(pcVar17,pFVar12);
  }
  else {
    if (cVar23 == 't') {
      bVar6 = open_library(library_file,&lib);
      if (bVar6 != '\0') {
        lVar16 = 0x10;
        for (lVar10 = 0; lVar10 < lib.nentries; lVar10 = lVar10 + 1) {
          pcVar17 = *(char **)((long)lib.dir + lVar16 + -0x10);
          if (bVar4) {
            printf("%-14s %6ld %6ld\n",pcVar17,*(undefined8 *)((long)lib.dir + lVar16 + -8),
                   *(undefined8 *)((long)&(lib.dir)->fname + lVar16));
          }
          else {
            puts(pcVar17);
          }
          lVar16 = lVar16 + 0x20;
        }
        if (bVar4) {
          printf("Revision:%ld  File count:%ld  String size:%ld\n",lib.rev,lib.nentries,lib.strsize)
          ;
        }
        goto LAB_00102730;
      }
LAB_00102640:
      pcVar17 = "Can\'t open dlb file";
    }
    else {
      if (cVar23 == 'x') {
        bVar6 = open_library(library_file,&lib);
        if (bVar6 == '\0') goto LAB_00102640;
        if ((int)uVar21 <= (int)unaff_R12D) {
          uVar21 = unaff_R12D;
        }
        for (lVar16 = 0; plVar20 = lib.dir, lVar16 < lib.nentries; lVar16 = lVar16 + 1) {
          plVar1 = lib.dir + lVar16;
          uVar25 = uVar15;
          if (unaff_RBX[uVar15] == (char *)0x0) {
            iVar7 = strcmp(plVar1->fname,"Directory");
            if (iVar7 != 0) goto LAB_0010253a;
          }
          else {
            for (; (long)uVar25 < (long)(ulong)unaff_R12D; uVar25 = uVar25 + 1) {
              iVar7 = strcmp(plVar1->fname,unaff_RBX[uVar25]);
              if (iVar7 == 0) goto LAB_0010252f;
            }
            uVar25 = (ulong)uVar21;
LAB_0010252f:
            if ((uint)uVar25 != unaff_R12D) {
LAB_0010253a:
              fseek((FILE *)lib.fdata,plVar20[lVar16].foffset,0);
              iVar7 = open(lib.dir[lVar16].fname,0x241,0x1a0);
              if (iVar7 < 0) {
                pcVar17 = "Can\'t create \'%s\'\n";
                pFVar12 = (FILE *)lib.dir[lVar16].fname;
                goto LAB_00102470;
              }
              lVar10 = lib.dir[lVar16].fsize;
              lVar18 = 0;
              do {
                lVar10 = lVar10 - lVar18;
                if (0x1fff < lVar10) {
                  lVar10 = 0x2000;
                }
                sVar11 = fread(buf,1,(long)(int)lVar10,(FILE *)lib.fdata);
                if ((int)lVar10 != (int)sVar11) {
                  pcVar17 = "Read Error in \'%s\'\n";
                  pFVar12 = (FILE *)lib.dir[lVar16].fname;
                  goto LAB_00102470;
                }
                sVar24 = (size_t)(int)sVar11;
                sVar11 = write(iVar7,buf,sVar24);
                if (sVar11 != sVar24) {
                  pcVar17 = "Write Error in \'%s\'\n";
                  pFVar12 = (FILE *)lib.dir[lVar16].fname;
                  goto LAB_00102470;
                }
                lVar18 = lVar18 + sVar24;
                lVar10 = lib.dir[lVar16].fsize;
              } while (lVar18 != lVar10);
              close(iVar7);
              if (bVar4) {
                printf("x %s\n",lib.dir[lVar16].fname);
              }
            }
          }
        }
LAB_00102730:
        close_library(&lib);
        goto LAB_0010273a;
      }
      pcVar17 = "Internal error - action.";
    }
LAB_001026b4:
    puts(pcVar17);
  }
LAB_001026b9:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    int i, r;
    int ap=2;				/* argument pointer */
    int cp;				/* command pointer */
    int iseen=0, fseen=0, verbose=0;	/* flags */
    char action=' ';
    library lib;

    if (argc > 0 && argv[0] && *argv[0]) progname = argv[0];

    if (argc<2) {
	usage();
	/* doesn't return */
    }

    for (cp=0; argv[1][cp]; cp++){
	switch(argv[1][cp]){
	    default:
		usage();	/* doesn't return */
	    case '-':	/* silently ignore */
		break;
	    case '?':
	    case 'h':
		verbose_help();
		break;
	    case 'I':
		if (ap == argc) usage();
		list_file=argv[ap++];
		if (iseen)
		    printf("Warning: multiple I options.  Previous ignored.\n");
		iseen=1;
		break;
	    case 'f':
		if (ap == argc) usage();
		library_file=argv[ap++];
		if (fseen)
		    printf("Warning: multiple f options.  Previous ignored.\n");
		fseen=1;
		break;
	    case 'C':
		if (ap == argc) usage();
		if (chdir(argv[ap++])){
		    printf("Can't chdir to %s\n",argv[--ap]);
		    xexit(EXIT_FAILURE);
		}
		break;
	    case 'v':
		verbose=1;
		break;
	    case 't':
	    case 'c':
	    case 'x':
		if (action != ' '){
		    printf("Only one of t,x,c may be specified.\n");
		    usage();
		}
		action=argv[1][cp];
		break;
	}
    }

    if (argv[ap] && iseen){
	printf("Too many arguments.\n");
	xexit(EXIT_FAILURE);
    }

    switch(action){
    default:
	printf("Internal error - action.\n");
	xexit(EXIT_FAILURE);
	break;
    case 't':			/* list archive */
	if (!open_library(library_file, &lib)) {
	    printf("Can't open dlb file\n");
	    xexit(EXIT_FAILURE);
	}

	for (i = 0; i < lib.nentries; i++) {
	    if (verbose)
		printf("%-14s %6ld %6ld\n",
		    lib.dir[i].fname, lib.dir[i].foffset, lib.dir[i].fsize);
	    else
		printf("%s\n", lib.dir[i].fname);
	}

	if (verbose)
	    printf("Revision:%ld  File count:%ld  String size:%ld\n",
		lib.rev, lib.nentries, lib.strsize);

	close_library(&lib);
	xexit(EXIT_SUCCESS);

    case 'x': {			/* extract archive contents */
	int f, n;
	long remainder, total_read;
	char buf[BUFSIZ];

	if (!open_library(library_file, &lib)) {
	    printf("Can't open dlb file\n");
	    xexit(EXIT_FAILURE);
	}

	for (i = 0; i < lib.nentries; i++) {
	    if (argv[ap]) {
		/* if files are listed, see if current is wanted */
		int c;
		for (c = ap; c < argc; c++)
		    if (!FILENAME_CMP(lib.dir[i].fname, argv[c])) break;
		if (c == argc) continue;	/* skip */
	    } else if (!FILENAME_CMP(lib.dir[i].fname, DLB_DIRECTORY)) {
		/*
		 * Don't extract the directory unless the user
		 * specifically asks for it.
		 *
		 * Perhaps we should never extract the directory???
		 */
		continue;
	    }
	    fseek(lib.fdata, lib.dir[i].foffset, SEEK_SET);

	    f = open(lib.dir[i].fname, O_WRONLY|O_TRUNC|O_BINARY|O_CREAT, 0640);
	    if (f < 0) {
		printf("Can't create '%s'\n", lib.dir[i].fname);
		xexit(EXIT_FAILURE);
	    }

	    /* read chunks from library and write them out */
	    total_read = 0;
	    do {
		remainder = lib.dir[i].fsize - total_read;
		if (remainder > (long) sizeof(buf))
		    r = (int) sizeof(buf);
		else
		    r = remainder;

		n = fread(buf, 1, r, lib.fdata);
		if (n != r) {
		    printf("Read Error in '%s'\n", lib.dir[i].fname);
		    xexit(EXIT_FAILURE);
		}
		if (write(f, buf, n) != n) {
		    printf("Write Error in '%s'\n", lib.dir[i].fname);
		    xexit(EXIT_FAILURE);
		}

		total_read += n;
	    } while (total_read != lib.dir[i].fsize);

	    close(f);

	    if (verbose) printf("x %s\n", lib.dir[i].fname);
	}

	close_library(&lib);
	xexit(EXIT_SUCCESS);
	}

    case 'c':			/* create archive */
	{
	libdir ld[MAX_DLB_FILES];
	char buf[BUFSIZ];
	int fd, out, nfiles = 0;
	long dir_size, slen, flen, fsiz;
	boolean rewrite_directory = FALSE;

	/*
	 * Get names from either/both an argv list and a file
	 * list.  This does not do any duplicate checking
	 */

	/* get file name in argv list */
	if (argv[ap]) {
	    for ( ; ap < argc; ap++, nfiles++) {
		if (nfiles >= MAX_DLB_FILES) {
		    printf("Too many dlb files!  Stopping at %d.\n",
								MAX_DLB_FILES);
		    xexit(EXIT_FAILURE);
		}
		ld[nfiles].fname = malloc(strlen(argv[ap]) + 1);
		strcpy(ld[nfiles].fname, argv[ap]);
	    }
	}

	if (iseen) {
	    /* want to do a list file */
	    FILE *list = fopen(list_file, "r");
	    if (!list) {
		printf("Can't open %s\n",list_file);
		xexit(EXIT_FAILURE);
	    }

	    /* get file names, one per line */
	    for ( ; fgets(buf, sizeof(buf), list); nfiles++) {
		if (nfiles >= MAX_DLB_FILES) {
		    printf("Too many dlb files!  Stopping at %d.\n",
								MAX_DLB_FILES);
		    xexit(EXIT_FAILURE);
		}
		*(eos(buf)-1) = '\0';	/* strip newline */
		ld[nfiles].fname = malloc(strlen(buf) + 1);
		strcpy(ld[nfiles].fname, buf);
	    }
	    fclose(list);
	}

	if (nfiles == 0) {
	    printf("No files to archive\n");
	    xexit(EXIT_FAILURE);
	}


	/*
	 * Get file sizes and name string length.  Don't include
	 * the directory information yet.
	 */
	for (i = 0, slen = 0, flen = 0; i < nfiles; i++) {
	    fd = open(ld[i].fname, O_RDONLY|O_BINARY, 0);
	    if (fd < 0) {
		printf("Can't open %s\n", ld[i].fname);
		xexit(EXIT_FAILURE);
	    }
	    ld[i].fsize = lseek(fd, 0, SEEK_END);
	    ld[i].foffset = flen;

	    slen += strlen(ld[i].fname);	/* don't add null (yet) */
	    flen += ld[i].fsize;
	    close(fd);
	}

	/* open output file */
	out = open(library_file, O_RDWR|O_TRUNC|O_BINARY|O_CREAT, FCMASK);
	if (out < 0) {
	    printf("Can't open %s for output\n", library_file);
	    xexit(EXIT_FAILURE);
	}

	/* caculate directory size */
	dir_size = 40			/* header line (see below) */
		   + ((nfiles+1)*11)	/* handling+file offset+SP+newline */
		   + slen+strlen(DLB_DIRECTORY); /* file names */

	/* write directory */
	write_dlb_directory(out, nfiles, ld, slen, dir_size, flen);

	flen = 0L;
	/* write each file */
	for (i = 0; i < nfiles; i++) {
	    fd = open(ld[i].fname, O_RDONLY|O_BINARY, 0);
	    if (fd < 0) {
		printf("Can't open input file '%s'\n", ld[i].fname);
		xexit(EXIT_FAILURE);
	    }
	    if (verbose) printf("%s\n",ld[i].fname);

	    fsiz = 0L;
	    while ((r = read(fd, buf, sizeof buf)) != 0) {
		if (r == -1) {
		    printf("Read Error in '%s'\n", ld[i].fname);
		    xexit(EXIT_FAILURE);
		}
		if (write(out, buf, r) != r) {
		    printf("Write Error in '%s'\n", ld[i].fname);
		    xexit(EXIT_FAILURE);
		}
		fsiz += r;
	    }
	    close(fd);
	    if (fsiz != ld[i].fsize) rewrite_directory = TRUE;
	    /* in case directory rewrite is needed */
	    ld[i].fsize = fsiz;
	    ld[i].foffset = flen;
	    flen += fsiz;
	}

	if (rewrite_directory) {
	    if (verbose) printf("(rewriting dlb directory info)\n");
	    lseek(out, 0, SEEK_SET);	/* rewind */
	    write_dlb_directory(out, nfiles, ld, slen, dir_size, flen);
	}

	for (i = 0; i < nfiles; i++)
	    free(ld[i].fname),  ld[i].fname = 0;

	close(out);
	xexit(EXIT_SUCCESS);
	}
    }

    xexit(EXIT_SUCCESS);
    /*NOTREACHED*/
    return 0;
}